

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalKdevelopGenerator::CreateFilelistFile
          (cmGlobalKdevelopGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *outputDir,
          string *projectDirIn,string *projectname,string *cmakeFilePattern,string *fileToOpen)

{
  uint uVar1;
  cmake *pcVar2;
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  bool bVar3;
  char *pcVar4;
  pointer ppcVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  pointer pbVar8;
  _Self __tmp;
  pointer ppcVar9;
  pointer ppcVar10;
  allocator local_582;
  allocator local_581;
  cmMakefile *local_580;
  string tmp;
  string projectDir;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string filename;
  ifstream oldFilelist;
  byte abStack_460 [488];
  cmGeneratedFileStream fout;
  
  std::operator+(&projectDir,projectDirIn,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oldFilelist,
                 outputDir,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oldFilelist,
                 projectname);
  std::operator+(&filename,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                 ".kdevelop.filelist");
  std::__cxx11::string::~string((string *)&fout);
  std::__cxx11::string::~string((string *)&oldFilelist);
  files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &files._M_t._M_impl.super__Rb_tree_header._M_header;
  files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
  tmp._M_string_length = 0;
  tmp.field_2._M_local_buf[0] = '\0';
  pcVar2 = ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->CMakeInstance;
  files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (ppcVar9 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      ppcVar9 !=
      (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
      super__Vector_impl_data._M_finish; ppcVar9 = ppcVar9 + 1) {
    local_580 = (*ppcVar9)->Makefile;
    for (pbVar8 = (local_580->ListFiles).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar8 != (local_580->ListFiles).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
      std::__cxx11::string::_M_assign((string *)&tmp);
      cmsys::SystemTools::ReplaceString(&tmp,projectDir._M_dataplus._M_p,"");
      if (*tmp._M_dataplus._M_p != '/') {
        pcVar4 = strstr(tmp._M_dataplus._M_p,"CMakeFiles/");
        if (pcVar4 == (char *)0x0) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&files,&tmp);
          cmsys::SystemTools::GetFilenameName((string *)&fout,&tmp);
          std::__cxx11::string::operator=((string *)&tmp,(string *)&fout);
          std::__cxx11::string::~string((string *)&fout);
          bVar3 = std::operator!=(&tmp,"CMakeLists.txt");
          if (bVar3) {
            pcVar4 = strstr(tmp._M_dataplus._M_p,".cmake");
            if (pcVar4 == (char *)0x0) {
              std::operator+((string *)&fout,&tmp,";");
              std::__cxx11::string::append((string *)cmakeFilePattern);
              std::__cxx11::string::~string((string *)&fout);
            }
          }
        }
      }
    }
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              (&targets,&(*ppcVar9)->GeneratorTargets);
    for (ppcVar5 = targets.
                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppcVar5 !=
        targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppcVar5 = ppcVar5 + 1) {
      sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      this_00 = *ppcVar5;
      this_01 = this_00->Target->Makefile;
      std::__cxx11::string::string((string *)&oldFilelist,"CMAKE_BUILD_TYPE",&local_581);
      pcVar4 = cmMakefile::GetSafeDefinition(this_01,(string *)&oldFilelist);
      std::__cxx11::string::string((string *)&fout,pcVar4,&local_582);
      cmGeneratorTarget::GetSourceFiles(this_00,&sources,(string *)&fout);
      std::__cxx11::string::~string((string *)&fout);
      std::__cxx11::string::~string((string *)&oldFilelist);
      for (ppcVar10 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          ppcVar10 !=
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppcVar10 = ppcVar10 + 1) {
        cmSourceFile::GetFullPath(*ppcVar10,(string *)0x0);
        std::__cxx11::string::_M_assign((string *)&tmp);
        cmsys::SystemTools::GetFilenamePath((string *)&fout,&tmp);
        std::__cxx11::string::append((char *)&fout);
        cmsys::SystemTools::GetFilenameWithoutExtension((string *)&oldFilelist,&tmp);
        std::__cxx11::string::append((string *)&fout);
        std::__cxx11::string::~string((string *)&oldFilelist);
        cmsys::SystemTools::ReplaceString(&tmp,projectDir._M_dataplus._M_p,"");
        if (*tmp._M_dataplus._M_p != '/') {
          pcVar4 = strstr(tmp._M_dataplus._M_p,"CMakeFiles/");
          if (pcVar4 == (char *)0x0) {
            cmsys::SystemTools::GetFilenameExtension((string *)&oldFilelist,&tmp);
            bVar3 = std::operator!=((string *)&oldFilelist,".moc");
            std::__cxx11::string::~string((string *)&oldFilelist);
            if (bVar3) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&files,&tmp);
              for (pbVar8 = (pcVar2->HeaderFileExtensions).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pbVar8 != (pcVar2->HeaderFileExtensions).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
                std::__cxx11::string::string((string *)&oldFilelist,(string *)&fout);
                std::__cxx11::string::append((char *)&oldFilelist);
                std::__cxx11::string::append((string *)&oldFilelist);
                bVar3 = cmsys::SystemTools::FileExists(_oldFilelist);
                if (bVar3) {
                  cmsys::SystemTools::ReplaceString
                            ((string *)&oldFilelist,projectDir._M_dataplus._M_p,"");
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&files,(string *)&oldFilelist);
                  std::__cxx11::string::~string((string *)&oldFilelist);
                  break;
                }
                std::__cxx11::string::~string((string *)&oldFilelist);
              }
            }
          }
        }
        std::__cxx11::string::~string((string *)&fout);
      }
      for (pbVar8 = (local_580->ListFiles).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar8 != (local_580->ListFiles).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
        std::__cxx11::string::_M_assign((string *)&tmp);
        cmsys::SystemTools::ReplaceString(&tmp,projectDir._M_dataplus._M_p,"");
        if (*tmp._M_dataplus._M_p != '/') {
          pcVar4 = strstr(tmp._M_dataplus._M_p,"CMakeFiles/");
          if (pcVar4 == (char *)0x0) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&files,&tmp);
          }
        }
      }
      std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                (&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
    }
    std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
              (&targets.
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>);
  }
  std::ifstream::ifstream(&oldFilelist,filename._M_dataplus._M_p,_S_in);
  if ((abStack_460[*(long *)(_oldFilelist + -0x18)] & 5) == 0) {
    while( true ) {
      bVar3 = cmsys::SystemTools::GetLineFromStream((istream *)&oldFilelist,&tmp,(bool *)0x0,-1);
      if (!bVar3) break;
      if (*tmp._M_dataplus._M_p != '/') {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                       &projectDir,&tmp);
        bVar3 = cmsys::SystemTools::FileExists
                          ((char *)fout.super_ofstream.
                                   super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream);
        if (bVar3) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&files,&tmp);
        }
        std::__cxx11::string::~string((string *)&fout);
      }
    }
    std::ifstream::close();
  }
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,filename._M_dataplus._M_p,false,None);
  uVar1 = *(uint *)(&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                     field_0x20 +
                   (long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3]);
  if ((uVar1 & 5) == 0) {
    std::__cxx11::string::assign((char *)fileToOpen);
    for (p_Var7 = files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &files._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      cmsys::SystemTools::CollapseFullPath
                ((string *)&targets,(string *)(p_Var7 + 1),projectDir._M_dataplus._M_p);
      std::__cxx11::string::operator=((string *)&tmp,(string *)&targets);
      std::__cxx11::string::~string((string *)&targets);
      if (fileToOpen->_M_string_length == 0) {
        cmsys::SystemTools::GetFilenameExtension((string *)&targets,&tmp);
        bVar3 = std::operator==((string *)&targets,".c");
        if (bVar3) {
LAB_003a0d8a:
          std::__cxx11::string::_M_assign((string *)fileToOpen);
        }
        else {
          bVar3 = std::operator==((string *)&targets,".cc");
          if (bVar3) goto LAB_003a0d8a;
          bVar3 = std::operator==((string *)&targets,".cpp");
          if (bVar3) goto LAB_003a0d8a;
          bVar3 = std::operator==((string *)&targets,".cxx");
          if (bVar3) goto LAB_003a0d8a;
          bVar3 = std::operator==((string *)&targets,".C");
          if (bVar3) goto LAB_003a0d8a;
          bVar3 = std::operator==((string *)&targets,".h");
          if (bVar3) goto LAB_003a0d8a;
          bVar3 = std::operator==((string *)&targets,".hpp");
          if (bVar3) goto LAB_003a0d8a;
        }
        std::__cxx11::string::~string((string *)&targets);
      }
      cmsys::SystemTools::ReplaceString(&tmp,projectDir._M_dataplus._M_p,"");
      if ((tmp._M_string_length != 0) && (*tmp._M_dataplus._M_p != '/')) {
        poVar6 = std::operator<<((ostream *)&fout,(string *)&tmp);
        std::operator<<(poVar6,"\n");
      }
    }
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  std::ifstream::~ifstream(&oldFilelist);
  std::__cxx11::string::~string((string *)&tmp);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&files._M_t);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::~string((string *)&projectDir);
  return (uVar1 & 5) == 0;
}

Assistant:

bool cmGlobalKdevelopGenerator::CreateFilelistFile(
  const std::vector<cmLocalGenerator*>& lgs, const std::string& outputDir,
  const std::string& projectDirIn, const std::string& projectname,
  std::string& cmakeFilePattern, std::string& fileToOpen)
{
  std::string projectDir = projectDirIn + "/";
  std::string filename = outputDir + "/" + projectname + ".kdevelop.filelist";

  std::set<std::string> files;
  std::string tmp;

  std::vector<std::string> const& hdrExts =
    this->GlobalGenerator->GetCMakeInstance()->GetHeaderExtensions();

  for (std::vector<cmLocalGenerator*>::const_iterator it = lgs.begin();
       it != lgs.end(); it++) {
    cmMakefile* makefile = (*it)->GetMakefile();
    const std::vector<std::string>& listFiles = makefile->GetListFiles();
    for (std::vector<std::string>::const_iterator lt = listFiles.begin();
         lt != listFiles.end(); lt++) {
      tmp = *lt;
      cmSystemTools::ReplaceString(tmp, projectDir.c_str(), "");
      // make sure the file is part of this source tree
      if ((tmp[0] != '/') &&
          (strstr(tmp.c_str(), cmake::GetCMakeFilesDirectoryPostSlash()) ==
           CM_NULLPTR)) {
        files.insert(tmp);
        tmp = cmSystemTools::GetFilenameName(tmp);
        // add all files which dont match the default
        // */CMakeLists.txt;*cmake; to the file pattern
        if ((tmp != "CMakeLists.txt") &&
            (strstr(tmp.c_str(), ".cmake") == CM_NULLPTR)) {
          cmakeFilePattern += tmp + ";";
        }
      }
    }

    // get all sources
    std::vector<cmGeneratorTarget*> targets = (*it)->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
         ti != targets.end(); ti++) {
      std::vector<cmSourceFile*> sources;
      cmGeneratorTarget* gt = *ti;
      gt->GetSourceFiles(sources, gt->Target->GetMakefile()->GetSafeDefinition(
                                    "CMAKE_BUILD_TYPE"));
      for (std::vector<cmSourceFile*>::const_iterator si = sources.begin();
           si != sources.end(); si++) {
        tmp = (*si)->GetFullPath();
        std::string headerBasename = cmSystemTools::GetFilenamePath(tmp);
        headerBasename += "/";
        headerBasename += cmSystemTools::GetFilenameWithoutExtension(tmp);

        cmSystemTools::ReplaceString(tmp, projectDir.c_str(), "");

        if ((tmp[0] != '/') &&
            (strstr(tmp.c_str(), cmake::GetCMakeFilesDirectoryPostSlash()) ==
             CM_NULLPTR) &&
            (cmSystemTools::GetFilenameExtension(tmp) != ".moc")) {
          files.insert(tmp);

          // check if there's a matching header around
          for (std::vector<std::string>::const_iterator ext = hdrExts.begin();
               ext != hdrExts.end(); ++ext) {
            std::string hname = headerBasename;
            hname += ".";
            hname += *ext;
            if (cmSystemTools::FileExists(hname.c_str())) {
              cmSystemTools::ReplaceString(hname, projectDir.c_str(), "");
              files.insert(hname);
              break;
            }
          }
        }
      }
      for (std::vector<std::string>::const_iterator lt = listFiles.begin();
           lt != listFiles.end(); lt++) {
        tmp = *lt;
        cmSystemTools::ReplaceString(tmp, projectDir.c_str(), "");
        if ((tmp[0] != '/') &&
            (strstr(tmp.c_str(), cmake::GetCMakeFilesDirectoryPostSlash()) ==
             CM_NULLPTR)) {
          files.insert(tmp);
        }
      }
    }
  }

  // check if the output file already exists and read it
  // insert all files which exist into the set of files
  cmsys::ifstream oldFilelist(filename.c_str());
  if (oldFilelist) {
    while (cmSystemTools::GetLineFromStream(oldFilelist, tmp)) {
      if (tmp[0] == '/') {
        continue;
      }
      std::string completePath = projectDir + tmp;
      if (cmSystemTools::FileExists(completePath.c_str())) {
        files.insert(tmp);
      }
    }
    oldFilelist.close();
  }

  // now write the new filename
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout) {
    return false;
  }

  fileToOpen = "";
  for (std::set<std::string>::const_iterator it = files.begin();
       it != files.end(); it++) {
    // get the full path to the file
    tmp = cmSystemTools::CollapseFullPath(*it, projectDir.c_str());
    // just select the first source file
    if (fileToOpen.empty()) {
      std::string ext = cmSystemTools::GetFilenameExtension(tmp);
      if ((ext == ".c") || (ext == ".cc") || (ext == ".cpp") ||
          (ext == ".cxx") || (ext == ".C") || (ext == ".h") ||
          (ext == ".hpp")) {
        fileToOpen = tmp;
      }
    }
    // make it relative to the project dir
    cmSystemTools::ReplaceString(tmp, projectDir.c_str(), "");
    // only put relative paths
    if (!tmp.empty() && tmp[0] != '/') {
      fout << tmp << "\n";
    }
  }
  return true;
}